

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

attr_list internal_create_attr_list(int iattr_count,int oattr_count)

{
  int iVar1;
  attr_list p_Var2;
  attr_p paVar3;
  attr_list *pp_Var4;
  int in_ESI;
  int in_EDI;
  attr_list list;
  uchar local_14;
  
  p_Var2 = (attr_list)calloc(1,0x18);
  p_Var2->list_of_lists = 0;
  p_Var2->ref_count = 1;
  if (in_ESI == 0) {
    (p_Var2->l).list.attributes = (attr_p)0x0;
  }
  else {
    paVar3 = (attr_p)calloc(1,(long)in_ESI * 0x18);
    (p_Var2->l).list.attributes = paVar3;
  }
  if (in_EDI == 0) {
    pp_Var4 = (attr_list *)calloc(1,0x10);
    (p_Var2->l).lists.lists = pp_Var4;
  }
  else {
    pp_Var4 = (attr_list *)calloc(1,(long)(in_EDI + -1) * 8 + 0xc);
    (p_Var2->l).lists.lists = pp_Var4;
  }
  ((p_Var2->l).list.iattrs)->other_attr_count = (uchar)in_ESI;
  ((p_Var2->l).list.iattrs)->int_attr_count = (uchar)in_EDI;
  if (words_bigendian == -1) {
    iVar1 = set_bigendian();
    local_14 = (uchar)iVar1;
  }
  else {
    local_14 = (uchar)words_bigendian;
  }
  ((p_Var2->l).list.iattrs)->byte_order = local_14;
  ((p_Var2->l).list.iattrs)->junk = '\0';
  return p_Var2;
}

Assistant:

static attr_list
internal_create_attr_list(int iattr_count, int oattr_count)
{
    attr_list list = calloc(1, sizeof(attr_list_struct));

    list->list_of_lists = 0;
    list->ref_count = 1;
    if (oattr_count == 0) {
	list->l.list.attributes = NULL;
    } else {
        list->l.list.attributes = calloc(1,  oattr_count * sizeof(attr));
    }
    if (iattr_count == 0) {
	/* adding 4 here so that we can pad the send structure up to 8 */
        list->l.list.iattrs = calloc(1, sizeof(struct int_attr_struct) + 4);
    } else {
        list->l.list.iattrs = calloc(1, sizeof(struct int_attr_struct) +
				     (iattr_count -1) * sizeof(int_attr));
    }
    list->l.list.iattrs->other_attr_count = oattr_count;
    list->l.list.iattrs->int_attr_count = iattr_count;
    list->l.list.iattrs->byte_order = WORDS_BIGENDIAN;
    list->l.list.iattrs->junk = 0;
    return list;  
}